

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

TaggedUnionExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::TaggedUnionExpression,slang::ast::Type_const&,slang::ast::Symbol_const&,slang::ast::Expression_const*&,slang::SourceRange>
          (BumpAllocator *this,Type *args,Symbol *args_1,Expression **args_2,SourceRange *args_3)

{
  SourceRange sourceRange;
  TaggedUnionExpression *pTVar1;
  TaggedUnionExpression *in_RCX;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  Type *in_R8;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pTVar1 = (TaggedUnionExpression *)
           allocate((BumpAllocator *)in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  sourceRange.endLoc = in_RSI;
  sourceRange.startLoc = in_RDX;
  ast::TaggedUnionExpression::TaggedUnionExpression
            (in_RCX,in_R8,(Symbol *)(in_R8->super_Symbol).name._M_len,
             *(Expression **)&in_R8->super_Symbol,sourceRange);
  return pTVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }